

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O0

size_t fdb_estimate_space_used(fdb_file_handle *fhandle)

{
  fdb_kvs_handle *handle_00;
  uint64_t uVar1;
  uint64_t uVar2;
  long lVar3;
  filemgr *in_RDI;
  filemgr *file;
  fdb_kvs_handle *handle;
  size_t nlivenodes;
  size_t datasize;
  size_t ret;
  fdb_kvs_handle *in_stack_00000078;
  kvs_stat_attr_t attr;
  size_t local_8;
  
  attr = KVS_STAT_NLIVENODES;
  if (in_RDI == (filemgr *)0x0) {
    local_8 = 0;
  }
  else {
    handle_00 = (fdb_kvs_handle *)in_RDI->filename;
    fdb_check_file_reopen(handle_00,(file_status_t *)0x0);
    fdb_sync_db_header(in_stack_00000078);
    uVar1 = _kvs_stat_get_sum(in_RDI,attr);
    uVar2 = _kvs_stat_get_sum(in_RDI,attr);
    lVar3 = uVar2 * (handle_00->config).blocksize + uVar1;
    local_8 = wal_get_datasize((filemgr *)0x149979);
    local_8 = local_8 + lVar3;
    if (((handle_00->config).bottom_up_index_build & 1U) != 0) {
      local_8 = (handle_00->fhandle->root->bub_ctx).space_used + local_8;
    }
  }
  return local_8;
}

Assistant:

LIBFDB_API
size_t fdb_estimate_space_used(fdb_file_handle *fhandle)
{
    size_t ret = 0;
    size_t datasize;
    size_t nlivenodes;
    fdb_kvs_handle *handle = NULL;
    struct filemgr *file;

    if (!fhandle) {
        return 0;
    }

    handle = fhandle->root;

    fdb_check_file_reopen(handle, NULL);
    fdb_sync_db_header(handle);

    file = handle->file;

    datasize = _kvs_stat_get_sum(file, KVS_STAT_DATASIZE);
    nlivenodes = _kvs_stat_get_sum(file, KVS_STAT_NLIVENODES);

    ret = datasize;
    ret += nlivenodes * handle->config.blocksize;
    ret += wal_get_datasize(handle->file);

    if (handle->config.bottom_up_index_build) {
        ret += handle->fhandle->root->bub_ctx.space_used;
    }

    return ret;
}